

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  cp_info *constantPool;
  bool bVar1;
  ClassRuntime *pCVar2;
  ClassFile *pCVar3;
  char *pcVar4;
  long lVar5;
  FILE *__stream;
  ostream *poVar6;
  ExecutionEngine *this;
  MethodArea *local_f8;
  ExecutionEngine *executionEngine;
  FILE *output;
  allocator local_b9;
  string local_b8 [8];
  string fileName;
  allocator local_91;
  string local_90 [8];
  string className;
  allocator local_59;
  string local_58 [32];
  ClassRuntime *local_38;
  ClassRuntime *classRuntime;
  MethodArea *methodArea;
  char *file_output;
  char *file_className;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  file_className = (char *)argv;
  argv_local._0_4_ = argc;
  if ((argc < 2) || (3 < argc)) {
    printf("Uso:\n");
    printf("\t./JVM arquivo_class.class \t ou,\n");
    printf("\t./JVM arquivo_class.class arquivo_saida.txt\n");
    exit(1);
  }
  file_output = argv[1];
  if (argc < 3) {
    local_f8 = (MethodArea *)0x0;
  }
  else {
    local_f8 = (MethodArea *)argv[2];
  }
  methodArea = local_f8;
  pCVar2 = (ClassRuntime *)MethodArea::getInstance();
  pcVar4 = file_output;
  classRuntime = pCVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar4,&local_59);
  pCVar2 = MethodArea::loadClassNamed((MethodArea *)pCVar2,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_38 = pCVar2;
  pCVar3 = ClassRuntime::getClassFile(pCVar2);
  constantPool = pCVar3->constant_pool;
  pCVar3 = ClassRuntime::getClassFile(local_38);
  pcVar4 = getFormattedConstant(constantPool,pCVar3->this_class);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar4,&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pcVar4 = file_output;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,pcVar4,&local_b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  lVar5 = std::__cxx11::string::find((char *)local_b8,0x14d05a);
  if (lVar5 != -1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&output,(ulong)local_b8);
    std::__cxx11::string::operator=(local_b8,(string *)&output);
    std::__cxx11::string::~string((string *)&output);
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_b8);
  if (!bVar1) {
    if (methodArea == (MethodArea *)0x0) {
      this = ExecutionEngine::getInstance();
      ExecutionEngine::startExecutionEngine(this,local_38);
    }
    else {
      __stream = fopen((char *)methodArea,"w+");
      if (__stream == (FILE *)0x0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Erro ao abrir arquivo ");
        poVar6 = std::operator<<(poVar6,(char *)methodArea);
        poVar6 = std::operator<<(poVar6,".");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        exit(2);
      }
      pCVar3 = ClassRuntime::getClassFile(local_38);
      printClassFile(pCVar3,(FILE *)__stream);
      fclose(__stream);
    }
    argv_local._4_4_ = 0;
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_90);
    return argv_local._4_4_;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"Nome do arquivo diferente do nome da classe.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc < 2 || argc > 3) {
        printf("Uso:\n");
        printf("\t./JVM arquivo_class.class \t ou,\n");
        printf("\t./JVM arquivo_class.class arquivo_saida.txt\n");
        exit(1);
    }
    
	const char *file_className = argv[1];
	const char *file_output = (argc < 3) ? NULL : argv[2];
    
    // Carregamento da classe de entrada.
    MethodArea &methodArea = MethodArea::getInstance();
    ClassRuntime *classRuntime = methodArea.loadClassNamed(file_className);
    // Fim do carregamento.
    
    // Verificação se o nome da classe de entrada é igual ao nome do arquivo.
    string className = getFormattedConstant(classRuntime->getClassFile()->constant_pool, classRuntime->getClassFile()->this_class);
    string fileName(file_className);
    if (fileName.find(".class") != fileName.npos) {
        fileName = fileName.substr(0, fileName.size() - 6);
    }
    if (className != fileName) {
        cerr << "Nome do arquivo diferente do nome da classe." << endl;
        exit(1);
    }
    // Fim da verificação
    
    // Salvando a estrutura do .class em um arquivo de saída ou realizando a execução da classe.
    if (file_output) {
        FILE *output = fopen(file_output, "w+");
        if (output == NULL) {
            cerr << "Erro ao abrir arquivo " << file_output << "." << endl;
            exit(2);
        }
        printClassFile(classRuntime->getClassFile(), output);
        fclose(output);
    } else {
        ExecutionEngine &executionEngine = ExecutionEngine::getInstance();
        executionEngine.startExecutionEngine(classRuntime);
    }
    
    return 0;
}